

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Glucose::SimpSolver::garbageCollect(SimpSolver *this)

{
  long *in_RDI;
  ClauseAllocator to;
  ClauseAllocator *in_stack_00000098;
  Solver *in_stack_000000a0;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  uint32_t in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  SimpSolver *in_stack_ffffffffffffffd0;
  RegionAllocator<unsigned_int> local_20;
  
  RegionAllocator<unsigned_int>::size((RegionAllocator<unsigned_int> *)(in_RDI + 0x68));
  RegionAllocator<unsigned_int>::wasted((RegionAllocator<unsigned_int> *)(in_RDI + 0x68));
  ClauseAllocator::ClauseAllocator
            ((ClauseAllocator *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac);
  cleanUpClauses(in_stack_ffffffffffffffd0);
  local_20._20_1_ = *(byte *)((long)in_RDI + 0x354) & 1;
  (**(code **)(*in_RDI + 0x78))(in_RDI,&local_20);
  Solver::relocAll(in_stack_000000a0,in_stack_00000098);
  if (1 < (int)in_RDI[5]) {
    in_stack_ffffffffffffffb4 =
         RegionAllocator<unsigned_int>::size((RegionAllocator<unsigned_int> *)(in_RDI + 0x68));
    in_stack_ffffffffffffffac = in_stack_ffffffffffffffb4 << 2;
    in_stack_ffffffffffffffb0 = RegionAllocator<unsigned_int>::size(&local_20);
    printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n",
           (ulong)in_stack_ffffffffffffffac,(ulong)(in_stack_ffffffffffffffb0 << 2));
  }
  ClauseAllocator::moveTo
            ((ClauseAllocator *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (ClauseAllocator *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  ClauseAllocator::~ClauseAllocator((ClauseAllocator *)0x126cb6);
  return;
}

Assistant:

void SimpSolver::garbageCollect()
{
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted()); 

    cleanUpClauses();
    to.extra_clause_field = ca.extra_clause_field; // NOTE: this is important to keep (or lose) the extra fields.
    relocAll(to);
    Solver::relocAll(to);
    if (verbosity >= 2)
        printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n", 
               ca.size()*ClauseAllocator::Unit_Size, to.size()*ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}